

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O1

double __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::GetDensity(ChElementBeamTaperedTimoshenko *this)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  double dVar4;
  double dVar5;
  
  peVar1 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2 = (peVar1->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var3 = (peVar1->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  dVar4 = (double)(**(code **)(*(long *)&(peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
                                         super_ChBeamSectionEulerAdvancedGeneric.
                                         super_ChBeamSectionEuler + 0x58))();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  peVar1 = (this->tapered_section).
           super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar2 = (peVar1->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var3 = (peVar1->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  dVar5 = (double)(**(code **)(*(long *)&(peVar2->super_ChBeamSectionRayleighAdvancedGeneric).
                                         super_ChBeamSectionEulerAdvancedGeneric.
                                         super_ChBeamSectionEuler + 0x58))();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  return (dVar5 + dVar4) * 0.5;
}

Assistant:

double ChElementBeamTaperedTimoshenko::GetDensity() {
    double mu1 = this->tapered_section->GetSectionA()->GetMassPerUnitLength();
    double mu2 = this->tapered_section->GetSectionB()->GetMassPerUnitLength();
    double mu = (mu1 + mu2) / 2.0;

    return mu;
}